

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O0

void TestSimulations(PlanningUnitDecPOMDPDiscrete *pu,shared_ptr<JointPolicyDiscrete> *jp,
                    size_t nrRuns)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong in_RDX;
  char *in_RSI;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  double dVar3;
  E *e;
  double er;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  SimulationResult *in_stack_fffffffffffffea8;
  SimulationResult *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string local_108 [40];
  double local_e0;
  shared_ptr local_d8 [64];
  SimulationResult local_98 [48];
  SimulationDecPOMDPDiscrete local_68 [80];
  ulong local_18;
  PlanningUnitDecPOMDPDiscrete *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting simulation of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," runs");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_68,local_8,(int)local_18,0x7fffffff,false);
  SimulationResult::SimulationResult(local_98);
  SimulationDecPOMDPDiscrete::RunSimulations(local_d8);
  SimulationResult::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  SimulationResult::~SimulationResult((SimulationResult *)local_d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Averaged reward: ");
  dVar3 = SimulationResult::GetAvgReward(local_98);
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_e0 = 0.0;
  local_e0 = (double)(**(code **)(*(long *)local_8 + 0x98))();
  poVar2 = std::operator<<((ostream *)&std::cout,"Expected reward: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_e0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_RSI,(allocator<char> *)poVar1);
  SimulationResult::Save(local_98,local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  SimulationResult::~SimulationResult(local_98);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_68);
  return;
}

Assistant:

void TestSimulations(PlanningUnitDecPOMDPDiscrete* pu,
                     boost::shared_ptr<JointPolicyDiscrete> jp, size_t nrRuns)
{
//    int nrRuns=10000;
    cout << "Starting simulation of "<<nrRuns<<" runs"<<endl;  

    SimulationDecPOMDPDiscrete sim(*pu,nrRuns);

    SimulationResult result;
    result=sim.RunSimulations(jp);

    cout << "Averaged reward: " << result.GetAvgReward() << endl;
    double er = 0.0;
    try{
        er = pu->GetExpectedReward();
        cout << "Expected reward: " << er  << endl;
    } catch(E& e) {
        //NullPlanner throws exception
        cout << "Expected reward was not defined by planning unit" << endl;
    }


    result.Save("/tmp/tst_sim_results");
}